

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O2

bool __thiscall
cmListCommand::HandleTransformCommand
          (cmListCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  ulong uVar1;
  _Rb_tree_header *p_Var2;
  cmMakefile *pcVar3;
  long lVar4;
  pointer pbVar5;
  _Base_ptr p_Var6;
  bool bVar7;
  bool bVar8;
  __type _Var9;
  char cVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  _Base_ptr p_Var14;
  _Rb_tree_node_base *p_Var15;
  _Base_ptr p_Var16;
  _Base_ptr p_Var17;
  long lVar18;
  _Base_ptr *pp_Var19;
  ostream *poVar20;
  unique_ptr<(anonymous_namespace)::TransformAction,_std::default_delete<(anonymous_namespace)::TransformAction>_>
  uVar21;
  unique_ptr<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
  uVar22;
  transform_error *ptVar23;
  ActionDescriptor *__args;
  ActionDescriptor *__args_00;
  pointer pbVar24;
  ulong uVar25;
  _Rb_tree_header *p_Var26;
  _Base_ptr p_Var27;
  _Link_type __node;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  varArgsExpanded;
  allocator<char> local_572;
  allocator<char> local_571;
  string REGEX;
  int value;
  undefined4 uStack_544;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_540;
  string AT;
  set<ActionDescriptor,_std::function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<ActionDescriptor>_>
  descriptors;
  code **local_4d0;
  undefined8 local_4c8;
  undefined1 local_4c0 [8];
  code *pcStack_4b8;
  Command command;
  ostringstream error;
  code *local_418;
  code *pcStack_410;
  int local_408;
  _Any_data local_400;
  _Manager_type local_3f0;
  _Invoker_type p_Stack_3e8;
  undefined1 local_3e0 [72];
  undefined1 local_398 [72];
  undefined1 local_350 [72];
  undefined1 local_308 [72];
  undefined1 local_2c0 [72];
  undefined1 local_278 [72];
  string FOR;
  string OUTPUT_VARIABLE;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  _Any_data local_110;
  code *local_100;
  code *local_f8;
  _Any_data local_f0;
  code *local_e0;
  code *local_d8;
  _Any_data local_d0;
  code *local_c0;
  code *local_b8;
  _Any_data local_b0;
  code *local_a0;
  code *local_98;
  _Any_data local_90;
  code *local_80;
  code *local_78;
  _Any_data local_70;
  code *local_60;
  code *local_58;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  pbVar24 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar24) < 0x41) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&error,"sub-command TRANSFORM requires an action to be specified.",
               (allocator<char> *)&command);
    cmCommand::SetError(&this->super_cmCommand,(string *)&error);
    std::__cxx11::string::~string((string *)&error);
    return false;
  }
  command.Name._M_dataplus._M_p = (pointer)&command.Name.field_2;
  command.Name._M_string_length = 0;
  pbVar24 = pbVar24 + 1;
  command.Name.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&command.ListName,(string *)pbVar24);
  command.Arguments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  command.Action._M_t.
  super___uniq_ptr_impl<(anonymous_namespace)::TransformAction,_std::default_delete<(anonymous_namespace)::TransformAction>_>
  ._M_t.
  super__Tuple_impl<0UL,_(anonymous_namespace)::TransformAction_*,_std::default_delete<(anonymous_namespace)::TransformAction>_>
  .super__Head_base<0UL,_(anonymous_namespace)::TransformAction_*,_false>._M_head_impl =
       (__uniq_ptr_data<(anonymous_namespace)::TransformAction,_std::default_delete<(anonymous_namespace)::TransformAction>,_true,_true>
        )(__uniq_ptr_impl<(anonymous_namespace)::TransformAction,_std::default_delete<(anonymous_namespace)::TransformAction>_>
          )0x0;
  command.Arguments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  command.Arguments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  command.Selector._M_t.
  super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
  ._M_t.
  super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
  .super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>._M_head_impl =
       (__uniq_ptr_data<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>,_true,_true>
        )(__uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
          )0x0;
  std::__cxx11::string::string((string *)&command.OutputName,(string *)pbVar24);
  _error = (pointer)0x0;
  pcStack_410 = std::
                _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmListCommand.cxx:820:7)>
                ::_M_invoke;
  local_418 = std::
              _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmListCommand.cxx:820:7)>
              ::_M_manager;
  std::
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function((function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)&descriptors,
             (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)&error);
  p_Var2 = &descriptors._M_t._M_impl.super__Rb_tree_header;
  descriptors._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  descriptors._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  descriptors._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  descriptors._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  descriptors._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  std::_Function_base::~_Function_base((_Function_base *)&error);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_130,"APPEND",(allocator<char> *)&AT);
  local_50._8_8_ = 0;
  local_38 = std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmListCommand.cxx:822:21)>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmListCommand.cxx:822:21)>
             ::_M_manager;
  local_50._M_unused._M_object = &command;
  HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::
  string>>const&)::ActionDescriptor::ActionDescriptor(std::__cxx11::string,int,std::function<std::
  __cxx11::string(std::__cxx11::string_const__>_(&error,&local_130,1,(transform_type *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_150,"PREPEND",(allocator<char> *)&FOR);
  local_70._8_8_ = 0;
  local_58 = std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmListCommand.cxx:830:21)>
             ::_M_invoke;
  local_60 = std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmListCommand.cxx:830:21)>
             ::_M_manager;
  local_70._M_unused._M_object = &command;
  HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::
  string>>const&)::ActionDescriptor::ActionDescriptor(std::__cxx11::string,int,std::function<std::
  __cxx11::string(std::__cxx11::string_const__>_(local_3e0,&local_150,1,(transform_type *)&local_70)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_170,"TOUPPER",(allocator<char> *)&OUTPUT_VARIABLE);
  local_90._8_8_ = 0;
  local_78 = std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmListCommand.cxx:838:21)>
             ::_M_invoke;
  local_80 = std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmListCommand.cxx:838:21)>
             ::_M_manager;
  local_90._M_unused._M_object = &command;
  HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::
  string>>const&)::ActionDescriptor::ActionDescriptor(std::__cxx11::string,int,std::function<std::
  __cxx11::string(std::__cxx11::string_const__>_(local_398,&local_170,0,(transform_type *)&local_90)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_190,"TOLOWER",(allocator<char> *)&varArgsExpanded);
  local_b0._8_8_ = 0;
  local_98 = std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmListCommand.cxx:846:21)>
             ::_M_invoke;
  local_a0 = std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmListCommand.cxx:846:21)>
             ::_M_manager;
  local_b0._M_unused._M_object = &command;
  HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::
  string>>const&)::ActionDescriptor::ActionDescriptor(std::__cxx11::string,int,std::function<std::
  __cxx11::string(std::__cxx11::string_const__>_(local_350,&local_190,0,(transform_type *)&local_b0)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b0,"STRIP",(allocator<char> *)&value);
  local_d0._8_8_ = 0;
  local_b8 = std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmListCommand.cxx:854:21)>
             ::_M_invoke;
  local_c0 = std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmListCommand.cxx:854:21)>
             ::_M_manager;
  local_d0._M_unused._M_object = &command;
  HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::
  string>>const&)::ActionDescriptor::ActionDescriptor(std::__cxx11::string,int,std::function<std::
  __cxx11::string(std::__cxx11::string_const__>_(local_308,&local_1b0,0,(transform_type *)&local_d0)
  ;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,"GENEX_STRIP",&local_571);
  local_f0._8_8_ = 0;
  local_d8 = std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmListCommand.cxx:862:21)>
             ::_M_invoke;
  local_e0 = std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmListCommand.cxx:862:21)>
             ::_M_manager;
  local_f0._M_unused._M_object = &command;
  HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::
  string>>const&)::ActionDescriptor::ActionDescriptor(std::__cxx11::string,int,std::function<std::
  __cxx11::string(std::__cxx11::string_const__>_(local_2c0,&local_1d0,0,(transform_type *)&local_f0)
  ;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f0,"REPLACE",&local_572);
  local_110._8_8_ = 0;
  local_f8 = std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmListCommand.cxx:872:21)>
             ::_M_invoke;
  local_100 = std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmListCommand.cxx:872:21)>
              ::_M_manager;
  local_110._M_unused._M_object = &command;
  HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::
  string>>const&)::ActionDescriptor::ActionDescriptor(std::__cxx11::string,int,std::function<std::
  __cxx11::string(std::__cxx11::string_const__>_
            (local_278,&local_1f0,2,(transform_type *)&local_110);
  REGEX._M_dataplus._M_p =
       (pointer)descriptors._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (descriptors._M_t._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
    p_Var14 = (_Base_ptr)0x0;
  }
  else {
    (descriptors._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = (_Base_ptr)0x0
    ;
    p_Var14 = (descriptors._M_t._M_impl.super__Rb_tree_header._M_header._M_right)->_M_left;
    if (p_Var14 == (_Base_ptr)0x0) {
      p_Var14 = descriptors._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
    }
  }
  descriptors._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  descriptors._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  descriptors._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  descriptors._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  REGEX._M_string_length = (size_type)p_Var14;
  REGEX.field_2._M_allocated_capacity =
       (size_type)
       (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
        *)&descriptors;
  for (lVar18 = 0; p_Var27 = &descriptors._M_t._M_impl.super__Rb_tree_header._M_header,
      lVar18 != 0x1f8; lVar18 = lVar18 + 0x48) {
    __node = (_Link_type)(&error + lVar18);
    if ((descriptors._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) ||
       (bVar7 = std::
                function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                ::operator()((function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                              *)&descriptors,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (descriptors._M_t._M_impl.super__Rb_tree_header._M_header._M_right + 1)
                             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              __node), !bVar7)) {
      bVar7 = true;
      pp_Var19 = &descriptors._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var27 = &descriptors._M_t._M_impl.super__Rb_tree_header._M_header;
      while (p_Var16 = *pp_Var19, p_Var16 != (_Base_ptr)0x0) {
        bVar7 = std::
                function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                ::operator()((function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                              *)&descriptors,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             __node,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)(p_Var16 + 1));
        p_Var27 = p_Var16;
        pp_Var19 = &p_Var16->_M_left + !bVar7;
      }
      p_Var15 = p_Var27;
      if (bVar7 != false) {
        if (p_Var27 == descriptors._M_t._M_impl.super__Rb_tree_header._M_header._M_left) {
          bVar7 = false;
          goto LAB_001bcde1;
        }
        p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_decrement(p_Var27);
      }
      bVar7 = std::
              function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              ::operator()((function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                            *)&descriptors,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (p_Var15 + 1),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           __node);
      if (bVar7) {
        bVar7 = p_Var15 != (_Rb_tree_node_base *)0x0 && !bVar7;
        goto LAB_001bcde1;
      }
    }
    else if (descriptors._M_t._M_impl.super__Rb_tree_header._M_header._M_right != (_Base_ptr)0x0) {
      bVar7 = false;
      p_Var27 = descriptors._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
LAB_001bcde1:
      bVar8 = true;
      p_Var16 = p_Var14;
      if (&descriptors._M_t._M_impl.super__Rb_tree_header != (_Rb_tree_header *)p_Var27 && !bVar7) {
        bVar8 = std::
                function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                ::operator()((function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                              *)&descriptors,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             __node,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)(p_Var27 + 1));
        p_Var16 = (_Base_ptr)REGEX._M_string_length;
      }
      if (p_Var16 == (_Rb_tree_node_base *)0x0) {
        p_Var16 = (_Base_ptr)operator_new(0x68);
        std::
        _Rb_tree<cmListCommand::HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::ActionDescriptor,cmListCommand::HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::ActionDescriptor,std::_Identity<cmListCommand::HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::ActionDescriptor>,std::function<bool(std::__cxx11::string_const&,std::__cxx11::string_const&)>,std::allocator<cmListCommand::HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::ActionDescriptor>>
        ::
        _M_construct_node<cmListCommand::HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::ActionDescriptor_const&>
                  ((_Rb_tree<cmListCommand::HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::ActionDescriptor,cmListCommand::HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::ActionDescriptor,std::_Identity<cmListCommand::HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::ActionDescriptor>,std::function<bool(std::__cxx11::string_const&,std::__cxx11::string_const&)>,std::allocator<cmListCommand::HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::ActionDescriptor>>
                    *)p_Var16,__node,__args);
        p_Var14 = (_Base_ptr)0x0;
      }
      else {
        REGEX._M_string_length = (size_type)p_Var16->_M_parent;
        if ((_Base_ptr)REGEX._M_string_length == (_Base_ptr)0x0) {
          REGEX._M_dataplus._M_p = (pointer)0x0;
          p_Var14 = (_Base_ptr)0x0;
        }
        else {
          p_Var14 = (_Base_ptr)REGEX._M_string_length;
          if (((_Base_ptr)REGEX._M_string_length)->_M_right == p_Var16) {
            ((_Base_ptr)REGEX._M_string_length)->_M_right = (_Base_ptr)0x0;
            p_Var6 = ((_Base_ptr)REGEX._M_string_length)->_M_left;
            if (((_Base_ptr)REGEX._M_string_length)->_M_left != (_Base_ptr)0x0) {
              do {
                p_Var17 = p_Var6;
                p_Var6 = p_Var17->_M_right;
              } while (p_Var17->_M_right != (_Base_ptr)0x0);
              p_Var14 = p_Var17->_M_left;
              REGEX._M_string_length = (size_type)p_Var14;
              if (p_Var14 == (_Base_ptr)0x0) {
                p_Var14 = p_Var17;
                REGEX._M_string_length = (size_type)p_Var17;
              }
            }
          }
          else {
            ((_Base_ptr)REGEX._M_string_length)->_M_left = (_Base_ptr)0x0;
          }
        }
        HandleTransformCommand::ActionDescriptor::~ActionDescriptor
                  ((ActionDescriptor *)(p_Var16 + 1));
        std::
        _Rb_tree<cmListCommand::HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::ActionDescriptor,cmListCommand::HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::ActionDescriptor,std::_Identity<cmListCommand::HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::ActionDescriptor>,std::function<bool(std::__cxx11::string_const&,std::__cxx11::string_const&)>,std::allocator<cmListCommand::HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::ActionDescriptor>>
        ::
        _M_construct_node<cmListCommand::HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::ActionDescriptor_const&>
                  ((_Rb_tree<cmListCommand::HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::ActionDescriptor,cmListCommand::HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::ActionDescriptor,std::_Identity<cmListCommand::HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::ActionDescriptor>,std::function<bool(std::__cxx11::string_const&,std::__cxx11::string_const&)>,std::allocator<cmListCommand::HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::ActionDescriptor>>
                    *)p_Var16,__node,__args_00);
      }
      std::_Rb_tree_insert_and_rebalance
                (bVar8,p_Var16,p_Var27,&descriptors._M_t._M_impl.super__Rb_tree_header._M_header);
      descriptors._M_t._M_impl.super__Rb_tree_header._M_node_count =
           descriptors._M_t._M_impl.super__Rb_tree_header._M_node_count + 1;
    }
  }
  std::
  _Rb_tree<ActionDescriptor,_ActionDescriptor,_std::_Identity<ActionDescriptor>,_std::function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<ActionDescriptor>_>
  ::_Reuse_or_alloc_node::~_Reuse_or_alloc_node((_Reuse_or_alloc_node *)&REGEX);
  lVar18 = 0x1b0;
  do {
    HandleTransformCommand::ActionDescriptor::~ActionDescriptor
              ((ActionDescriptor *)(&error + lVar18));
    lVar18 = lVar18 + -0x48;
  } while (lVar18 != -0x48);
  std::_Function_base::~_Function_base((_Function_base *)&local_110);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::_Function_base::~_Function_base((_Function_base *)&local_f0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::_Function_base::~_Function_base((_Function_base *)&local_d0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::_Function_base::~_Function_base((_Function_base *)&local_b0);
  std::__cxx11::string::~string((string *)&local_190);
  std::_Function_base::~_Function_base((_Function_base *)&local_90);
  std::__cxx11::string::~string((string *)&local_170);
  std::_Function_base::~_Function_base((_Function_base *)&local_70);
  std::__cxx11::string::~string((string *)&local_150);
  std::_Function_base::~_Function_base((_Function_base *)&local_50);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::string
            ((string *)&local_4d0,
             (string *)
             ((args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start + 2));
  _error = &local_418;
  if (local_4d0 == (code **)local_4c0) {
    pcStack_410 = pcStack_4b8;
  }
  else {
    _error = local_4d0;
  }
  local_4d0 = (code **)local_4c0;
  local_4c8 = 0;
  local_4c0[0] = 0;
  local_408 = 0;
  local_400._M_unused._M_object = (void *)0x0;
  local_400._8_8_ = 0;
  local_3f0 = (_Manager_type)0x0;
  p_Stack_3e8 = (_Invoker_type)0x0;
  pp_Var19 = &descriptors._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  while (p_Var14 = *pp_Var19, (_Rb_tree_header *)p_Var14 != (_Rb_tree_header *)0x0) {
    bVar7 = std::
            function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
            ::operator()((function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                          *)&descriptors,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (p_Var14 + 1),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&error
                        );
    if (!bVar7) {
      p_Var27 = p_Var14;
    }
    pp_Var19 = &p_Var14->_M_left + bVar7;
  }
  p_Var2 = &descriptors._M_t._M_impl.super__Rb_tree_header;
  p_Var26 = p_Var2;
  if (((_Rb_tree_header *)p_Var27 != p_Var2) &&
     (bVar7 = std::
              function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              ::operator()((function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                            *)&descriptors,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &error,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&((_Rb_tree_header *)p_Var27)->_M_node_count),
     p_Var26 = (_Rb_tree_header *)p_Var27, bVar7)) {
    p_Var26 = p_Var2;
  }
  HandleTransformCommand::ActionDescriptor::~ActionDescriptor((ActionDescriptor *)&error);
  std::__cxx11::string::~string((string *)&local_4d0);
  if (p_Var26 == p_Var2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&error);
    poVar20 = std::operator<<((ostream *)&error," sub-command TRANSFORM, ");
    poVar20 = std::operator<<(poVar20,(string *)
                                      ((args->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start + 2));
    std::operator<<(poVar20," invalid action.");
    std::__cxx11::stringbuf::str();
    cmCommand::SetError(&this->super_cmCommand,&REGEX);
  }
  else {
    if ((long)*(int *)((long)(p_Var26 + 1) + 0x18) + 3U <=
        (ulong)((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 5)) {
      std::__cxx11::string::_M_assign((string *)&command);
      uVar25 = (long)*(int *)((long)(p_Var26 + 1) + 0x18) + 3;
      if (0 < (long)*(int *)((long)(p_Var26 + 1) + 0x18)) {
        pbVar24 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        vector<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&error,
                   pbVar24 + 3,pbVar24 + uVar25,(allocator_type *)&REGEX);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_move_assign(&command.Arguments,&error);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&error);
      }
      bVar7 = std::operator==(&command.Name,"REPLACE");
      uVar21 = command.Action;
      if (bVar7) {
        uVar21._M_t.
        super___uniq_ptr_impl<(anonymous_namespace)::TransformAction,_std::default_delete<(anonymous_namespace)::TransformAction>_>
        ._M_t.
        super__Tuple_impl<0UL,_(anonymous_namespace)::TransformAction_*,_std::default_delete<(anonymous_namespace)::TransformAction>_>
        .super__Head_base<0UL,_(anonymous_namespace)::TransformAction_*,_false>._M_head_impl =
             (__uniq_ptr_data<(anonymous_namespace)::TransformAction,_std::default_delete<(anonymous_namespace)::TransformAction>,_true,_true>
              )operator_new(0x160);
        pbVar24 = command.Arguments.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pcVar3 = (this->super_cmCommand).Makefile;
        *(undefined ***)
         uVar21._M_t.
         super___uniq_ptr_impl<(anonymous_namespace)::TransformAction,_std::default_delete<(anonymous_namespace)::TransformAction>_>
         ._M_t.
         super__Tuple_impl<0UL,_(anonymous_namespace)::TransformAction_*,_std::default_delete<(anonymous_namespace)::TransformAction>_>
         .super__Head_base<0UL,_(anonymous_namespace)::TransformAction_*,_false>._M_head_impl =
             &PTR__TransformReplace_0057a400;
        std::__cxx11::string::string
                  ((string *)&REGEX,
                   (string *)
                   (command.Arguments.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 1));
        cmStringReplaceHelper::cmStringReplaceHelper
                  ((cmStringReplaceHelper *)
                   ((long)uVar21._M_t.
                          super___uniq_ptr_impl<(anonymous_namespace)::TransformAction,_std::default_delete<(anonymous_namespace)::TransformAction>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_(anonymous_namespace)::TransformAction_*,_std::default_delete<(anonymous_namespace)::TransformAction>_>
                          .super__Head_base<0UL,_(anonymous_namespace)::TransformAction_*,_false>.
                          _M_head_impl + 8),pbVar24,&REGEX,pcVar3);
        std::__cxx11::string::~string((string *)&REGEX);
        cmMakefile::ClearMatches(pcVar3);
        if (*(long *)((long)uVar21._M_t.
                            super___uniq_ptr_impl<(anonymous_namespace)::TransformAction,_std::default_delete<(anonymous_namespace)::TransformAction>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_(anonymous_namespace)::TransformAction_*,_std::default_delete<(anonymous_namespace)::TransformAction>_>
                            .super__Head_base<0UL,_(anonymous_namespace)::TransformAction_*,_false>.
                            _M_head_impl + 0x108) == 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&error);
          poVar20 = std::operator<<((ostream *)&error,
                                    "sub-command TRANSFORM, action REPLACE: Failed to compile regex \""
                                   );
          poVar20 = std::operator<<(poVar20,(string *)
                                            command.Arguments.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
          std::operator<<(poVar20,"\".");
          ptVar23 = (transform_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringbuf::str();
          anon_unknown.dwarf_433462::transform_error::transform_error(ptVar23,&AT);
          __cxa_throw(ptVar23,&(anonymous_namespace)::transform_error::typeinfo,
                      std::runtime_error::~runtime_error);
        }
        if (*(char *)((long)uVar21._M_t.
                            super___uniq_ptr_impl<(anonymous_namespace)::TransformAction,_std::default_delete<(anonymous_namespace)::TransformAction>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_(anonymous_namespace)::TransformAction_*,_std::default_delete<(anonymous_namespace)::TransformAction>_>
                            .super__Head_base<0UL,_(anonymous_namespace)::TransformAction_*,_false>.
                            _M_head_impl + 0x118) == '\0') {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&error);
          poVar20 = std::operator<<((ostream *)&error,"sub-command TRANSFORM, action REPLACE: ");
          poVar20 = std::operator<<(poVar20,(string *)
                                            ((long)uVar21._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<(anonymous_namespace)::TransformAction,_std::default_delete<(anonymous_namespace)::TransformAction>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_(anonymous_namespace)::TransformAction_*,_std::default_delete<(anonymous_namespace)::TransformAction>_>
                                                  .
                                                  super__Head_base<0UL,_(anonymous_namespace)::TransformAction_*,_false>
                                                  ._M_head_impl + 8));
          std::operator<<(poVar20,".");
          ptVar23 = (transform_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringbuf::str();
          anon_unknown.dwarf_433462::transform_error::transform_error(ptVar23,&AT);
          __cxa_throw(ptVar23,&(anonymous_namespace)::transform_error::typeinfo,
                      std::runtime_error::~runtime_error);
        }
        if ((__uniq_ptr_impl<(anonymous_namespace)::TransformAction,_std::default_delete<(anonymous_namespace)::TransformAction>_>
             )command.Action._M_t.
              super___uniq_ptr_impl<(anonymous_namespace)::TransformAction,_std::default_delete<(anonymous_namespace)::TransformAction>_>
              ._M_t.
              super__Tuple_impl<0UL,_(anonymous_namespace)::TransformAction_*,_std::default_delete<(anonymous_namespace)::TransformAction>_>
              .super__Head_base<0UL,_(anonymous_namespace)::TransformAction_*,_false>._M_head_impl
            != (__uniq_ptr_impl<(anonymous_namespace)::TransformAction,_std::default_delete<(anonymous_namespace)::TransformAction>_>
                )0x0) {
          lVar18 = *(long *)command.Action._M_t.
                            super___uniq_ptr_impl<(anonymous_namespace)::TransformAction,_std::default_delete<(anonymous_namespace)::TransformAction>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_(anonymous_namespace)::TransformAction_*,_std::default_delete<(anonymous_namespace)::TransformAction>_>
                            .super__Head_base<0UL,_(anonymous_namespace)::TransformAction_*,_false>.
                            _M_head_impl;
          command.Action._M_t.
          super___uniq_ptr_impl<(anonymous_namespace)::TransformAction,_std::default_delete<(anonymous_namespace)::TransformAction>_>
          ._M_t.
          super__Tuple_impl<0UL,_(anonymous_namespace)::TransformAction_*,_std::default_delete<(anonymous_namespace)::TransformAction>_>
          .super__Head_base<0UL,_(anonymous_namespace)::TransformAction_*,_false>._M_head_impl =
               uVar21._M_t.
               super___uniq_ptr_impl<(anonymous_namespace)::TransformAction,_std::default_delete<(anonymous_namespace)::TransformAction>_>
               ._M_t.
               super__Tuple_impl<0UL,_(anonymous_namespace)::TransformAction_*,_std::default_delete<(anonymous_namespace)::TransformAction>_>
               .super__Head_base<0UL,_(anonymous_namespace)::TransformAction_*,_false>._M_head_impl;
          (**(code **)(lVar18 + 8))();
          uVar21._M_t.
          super___uniq_ptr_impl<(anonymous_namespace)::TransformAction,_std::default_delete<(anonymous_namespace)::TransformAction>_>
          ._M_t.
          super__Tuple_impl<0UL,_(anonymous_namespace)::TransformAction_*,_std::default_delete<(anonymous_namespace)::TransformAction>_>
          .super__Head_base<0UL,_(anonymous_namespace)::TransformAction_*,_false>._M_head_impl =
               command.Action._M_t.
               super___uniq_ptr_impl<(anonymous_namespace)::TransformAction,_std::default_delete<(anonymous_namespace)::TransformAction>_>
               ._M_t.
               super__Tuple_impl<0UL,_(anonymous_namespace)::TransformAction_*,_std::default_delete<(anonymous_namespace)::TransformAction>_>
               .super__Head_base<0UL,_(anonymous_namespace)::TransformAction_*,_false>._M_head_impl;
        }
      }
      command.Action._M_t.
      super___uniq_ptr_impl<(anonymous_namespace)::TransformAction,_std::default_delete<(anonymous_namespace)::TransformAction>_>
      ._M_t.
      super__Tuple_impl<0UL,_(anonymous_namespace)::TransformAction_*,_std::default_delete<(anonymous_namespace)::TransformAction>_>
      .super__Head_base<0UL,_(anonymous_namespace)::TransformAction_*,_false>._M_head_impl =
           uVar21._M_t.
           super___uniq_ptr_impl<(anonymous_namespace)::TransformAction,_std::default_delete<(anonymous_namespace)::TransformAction>_>
           ._M_t.
           super__Tuple_impl<0UL,_(anonymous_namespace)::TransformAction_*,_std::default_delete<(anonymous_namespace)::TransformAction>_>
           .super__Head_base<0UL,_(anonymous_namespace)::TransformAction_*,_false>._M_head_impl;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&REGEX,"REGEX",(allocator<char> *)&error);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&AT,"AT",(allocator<char> *)&error);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&FOR,"FOR",(allocator<char> *)&error);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&OUTPUT_VARIABLE,"OUTPUT_VARIABLE",(allocator<char> *)&error);
      uVar22 = command.Selector;
LAB_001bd37a:
      command.Selector._M_t.
      super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
      ._M_t.
      super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
      .super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>._M_head_impl =
           uVar22._M_t.
           super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
           ._M_t.
           super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
           .super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>._M_head_impl;
      pbVar24 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar24 >> 5) <= uVar25)
      {
        varArgsExpanded.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        varArgsExpanded.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        varArgsExpanded.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        bVar7 = GetList(this,&varArgsExpanded,&command.ListName);
        if (bVar7) {
          uVar22 = command.Selector;
          if ((__uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
               )command.Selector._M_t.
                super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                ._M_t.
                super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                .super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>.
                _M_head_impl ==
              (__uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
               )0x0) {
            uVar22._M_t.
            super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
            ._M_t.
            super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
            .super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>._M_head_impl =
                 (__uniq_ptr_data<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>,_true,_true>
                  )operator_new(0x28);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&error,"NO SELECTOR",(allocator<char> *)&value);
            anon_unknown.dwarf_433462::TransformSelector::TransformSelector
                      ((TransformSelector *)
                       uVar22._M_t.
                       super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                       .super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>.
                       _M_head_impl,(string *)&error);
            std::__cxx11::string::~string((string *)&error);
            *(undefined ***)
             uVar22._M_t.
             super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
             ._M_t.
             super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
             .super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>._M_head_impl
                 = &PTR__TransformSelector_0057a600;
            if ((__uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                 )command.Selector._M_t.
                  super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                  .super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>.
                  _M_head_impl !=
                (__uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                 )0x0) {
              lVar18 = *(long *)command.Selector._M_t.
                                super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                                .
                                super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>
                                ._M_head_impl;
              command.Selector._M_t.
              super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
              ._M_t.
              super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
              .super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>._M_head_impl
                   = uVar22._M_t.
                     super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                     .super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>.
                     _M_head_impl;
              (**(code **)(lVar18 + 8))();
              uVar22._M_t.
              super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
              ._M_t.
              super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
              .super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>._M_head_impl
                   = command.Selector._M_t.
                     super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                     .super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>.
                     _M_head_impl;
            }
          }
          command.Selector._M_t.
          super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
          ._M_t.
          super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
          .super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>._M_head_impl =
               uVar22._M_t.
               super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
               ._M_t.
               super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
               .super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>.
               _M_head_impl;
          (**(code **)(*(long *)command.Selector._M_t.
                                super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                                .
                                super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>
                                ._M_head_impl + 0x20))
                    (command.Selector._M_t.
                     super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                     .super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>.
                     _M_head_impl,&varArgsExpanded,(long)(p_Var26 + 1) + 0x20);
          pcVar3 = (this->super_cmCommand).Makefile;
          cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    ((string *)&error,&varArgsExpanded,";");
          cmMakefile::AddDefinition(pcVar3,&command.OutputName,(char *)_error);
          std::__cxx11::string::~string((string *)&error);
        }
        else {
          cmMakefile::AddDefinition((this->super_cmCommand).Makefile,&command.OutputName,"");
        }
        bVar7 = true;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&varArgsExpanded);
        goto LAB_001be055;
      }
      _Var9 = std::operator==(pbVar24 + uVar25,&REGEX);
      if ((((_Var9) ||
           (_Var9 = std::operator==((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar25,&AT), _Var9)
           ) || (_Var9 = std::operator==((args->
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start + uVar25,&FOR),
                _Var9)) &&
         ((__uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
           )command.Selector._M_t.
            super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
            ._M_t.
            super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
            .super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>._M_head_impl
          != (__uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
              )0x0)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&error);
        poVar20 = std::operator<<((ostream *)&error,
                                  "sub-command TRANSFORM, selector already specified (");
        poVar20 = std::operator<<(poVar20,(string *)
                                          ((long)command.Selector._M_t.
                                                 super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                                                 .
                                                 super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>
                                                 ._M_head_impl + 8));
        std::operator<<(poVar20,").");
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,(string *)&varArgsExpanded);
LAB_001bdb39:
        std::__cxx11::string::~string((string *)&varArgsExpanded);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error);
        goto LAB_001be053;
      }
      _Var9 = std::operator==((args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + uVar25,&REGEX);
      if (_Var9) {
        pbVar24 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        lVar18 = uVar25 + 1;
        if ((long)(args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar24 >> 5 != lVar18) {
          uVar22._M_t.
          super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
          ._M_t.
          super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
          .super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>._M_head_impl =
               (__uniq_ptr_data<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>,_true,_true>
                )operator_new(0xf8);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&error,"REGEX",(allocator<char> *)&varArgsExpanded);
          anon_unknown.dwarf_433462::TransformSelector::TransformSelector
                    ((TransformSelector *)
                     uVar22._M_t.
                     super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                     .super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>.
                     _M_head_impl,(string *)&error);
          std::__cxx11::string::~string((string *)&error);
          *(undefined ***)
           uVar22._M_t.
           super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
           ._M_t.
           super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
           .super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>._M_head_impl =
               &PTR__TransformSelectorRegex_0057a478;
          cmsys::RegularExpression::RegularExpression
                    ((RegularExpression *)
                     ((long)uVar22._M_t.
                            super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                            .
                            super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>
                            ._M_head_impl + 0x28),pbVar24 + lVar18);
          if ((__uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
               )command.Selector._M_t.
                super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                ._M_t.
                super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                .super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>.
                _M_head_impl !=
              (__uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
               )0x0) {
            lVar4 = *(long *)command.Selector._M_t.
                             super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                             .
                             super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>
                             ._M_head_impl;
            command.Selector._M_t.
            super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
            ._M_t.
            super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
            .super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>._M_head_impl =
                 uVar22._M_t.
                 super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                 .super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>.
                 _M_head_impl;
            (**(code **)(lVar4 + 8))();
            uVar22._M_t.
            super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
            ._M_t.
            super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
            .super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>._M_head_impl =
                 command.Selector._M_t.
                 super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                 .super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>.
                 _M_head_impl;
          }
          command.Selector._M_t.
          super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
          ._M_t.
          super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
          .super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>._M_head_impl =
               uVar22._M_t.
               super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
               ._M_t.
               super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
               .super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>.
               _M_head_impl;
          cVar10 = (**(code **)(*(long *)command.Selector._M_t.
                                         super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                                         .
                                         super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>
                                         ._M_head_impl + 0x10))
                             (command.Selector._M_t.
                              super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                              .
                              super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>
                              ._M_head_impl,0);
          if (cVar10 == '\0') {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&error);
            std::operator<<((ostream *)&error,
                            "sub-command TRANSFORM, selector REGEX failed to compile regex \"");
            poVar20 = std::operator<<((ostream *)&error,
                                      (string *)
                                      ((args->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start + lVar18));
            std::operator<<(poVar20,"\".");
            std::__cxx11::stringbuf::str();
            cmCommand::SetError(&this->super_cmCommand,(string *)&varArgsExpanded);
            goto LAB_001bdb39;
          }
          uVar25 = uVar25 + 2;
          uVar22 = command.Selector;
          goto LAB_001bd37a;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&error,
                   "sub-command TRANSFORM, selector REGEX expects \'regular expression\' argument.",
                   (allocator<char> *)&varArgsExpanded);
        cmCommand::SetError(&this->super_cmCommand,(string *)&error);
      }
      else {
        _Var9 = std::operator==((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + uVar25,&AT);
        if (_Var9) {
          varArgsExpanded.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          varArgsExpanded.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          varArgsExpanded.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          lVar18 = uVar25 * 0x20;
          while( true ) {
            uVar25 = uVar25 + 1;
            pbVar24 = (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            if ((ulong)((long)(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar24 >> 5) <=
                uVar25) break;
            iVar11 = std::__cxx11::stoi((string *)((long)&pbVar24[1]._M_dataplus._M_p + lVar18),
                                        (size_t *)&error,10);
            value = iVar11;
            if ((code **)_error !=
                *(code ***)
                 ((long)&(args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start[1]._M_string_length + lVar18))
            break;
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)&varArgsExpanded,&value);
            lVar18 = lVar18 + 0x20;
          }
          pbVar5 = varArgsExpanded.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          pbVar24 = varArgsExpanded.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (varArgsExpanded.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              varArgsExpanded.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&error,
                       "sub-command TRANSFORM, selector AT expects at least one numeric value.",
                       (allocator<char> *)&value);
            cmCommand::SetError(&this->super_cmCommand,(string *)&error);
            std::__cxx11::string::~string((string *)&error);
            uVar22 = command.Selector;
          }
          else {
            uVar22._M_t.
            super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
            ._M_t.
            super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
            .super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>._M_head_impl =
                 (__uniq_ptr_data<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>,_true,_true>
                  )operator_new(0x40);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&error,"AT",(allocator<char> *)&value);
            anon_unknown.dwarf_433462::TransformSelector::TransformSelector
                      ((TransformSelector *)
                       uVar22._M_t.
                       super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                       .super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>.
                       _M_head_impl,(string *)&error);
            *(undefined ***)
             uVar22._M_t.
             super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
             ._M_t.
             super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
             .super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>._M_head_impl
                 = &PTR__TransformSelectorIndexes_0057a578;
            std::vector<int,_std::allocator<int>_>::vector
                      ((vector<int,_std::allocator<int>_> *)
                       ((long)uVar22._M_t.
                              super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                              .
                              super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>
                              ._M_head_impl + 0x28),
                       (vector<int,_std::allocator<int>_> *)&varArgsExpanded);
            std::__cxx11::string::~string((string *)&error);
            *(undefined ***)
             uVar22._M_t.
             super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
             ._M_t.
             super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
             .super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>._M_head_impl
                 = &PTR__TransformSelectorIndexes_0057a510;
            if ((__uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                 )command.Selector._M_t.
                  super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                  .super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>.
                  _M_head_impl !=
                (__uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                 )0x0) {
              lVar18 = *(long *)command.Selector._M_t.
                                super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                                .
                                super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>
                                ._M_head_impl;
              command.Selector._M_t.
              super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
              ._M_t.
              super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
              .super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>._M_head_impl
                   = uVar22._M_t.
                     super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                     .super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>.
                     _M_head_impl;
              (**(code **)(lVar18 + 8))();
              uVar22._M_t.
              super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
              ._M_t.
              super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
              .super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>._M_head_impl
                   = command.Selector._M_t.
                     super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                     .super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>.
                     _M_head_impl;
            }
          }
          command.Selector._M_t.
          super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
          ._M_t.
          super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
          .super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>._M_head_impl =
               uVar22._M_t.
               super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
               ._M_t.
               super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
               .super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>.
               _M_head_impl;
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    ((_Vector_base<int,_std::allocator<int>_> *)&varArgsExpanded);
          uVar22 = command.Selector;
          if (pbVar24 == pbVar5) goto LAB_001be053;
          goto LAB_001bd37a;
        }
        _Var9 = std::operator==((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + uVar25,&FOR);
        if (_Var9) {
          pbVar24 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          uVar1 = uVar25 + 2;
          if ((ulong)((long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar24 >> 5) <=
              uVar1) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&error,
                       "sub-command TRANSFORM, selector FOR expects, at least, two arguments.",
                       (allocator<char> *)&varArgsExpanded);
            cmCommand::SetError(&this->super_cmCommand,(string *)&error);
            goto LAB_001be046;
          }
          iVar11 = std::__cxx11::stoi(pbVar24 + uVar25 + 1,(size_t *)&error,10);
          pbVar24 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          if ((code **)_error == (code **)pbVar24[uVar25 + 1]._M_string_length) {
            iVar12 = std::__cxx11::stoi(pbVar24 + uVar1,(size_t *)&error,10);
            pbVar24 = (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            if ((code **)_error == (code **)pbVar24[uVar1]._M_string_length) {
              uVar1 = uVar25 + 3;
              if ((uVar1 < (ulong)((long)(args->
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar24
                                  >> 5)) &&
                 (iVar13 = std::__cxx11::stoi(pbVar24 + uVar1,(size_t *)&error,10),
                 (code **)_error ==
                 (code **)(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start[uVar1]._M_string_length)) {
                uVar25 = uVar25 + 4;
                if (iVar13 < 0) {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&error,
                             "sub-command TRANSFORM, selector FOR expects non negative numeric value for <step>."
                             ,(allocator<char> *)&varArgsExpanded);
                  cmCommand::SetError(&this->super_cmCommand,(string *)&error);
                  std::__cxx11::string::~string((string *)&error);
                }
              }
              else {
                iVar13 = 1;
                uVar25 = uVar1;
              }
              uVar22._M_t.
              super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
              ._M_t.
              super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
              .super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>._M_head_impl
                   = (__uniq_ptr_data<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>,_true,_true>
                      )operator_new(0x50);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&error,"FOR",(allocator<char> *)&varArgsExpanded);
              anon_unknown.dwarf_433462::TransformSelector::TransformSelector
                        ((TransformSelector *)
                         uVar22._M_t.
                         super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                         .super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>.
                         _M_head_impl,(string *)&error);
              *(undefined ***)
               uVar22._M_t.
               super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
               ._M_t.
               super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
               .super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>.
               _M_head_impl = &PTR__TransformSelectorIndexes_0057a578;
              ((TransformSelector *)
              ((long)uVar22._M_t.
                     super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                     .super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>.
                     _M_head_impl + 0x28))->_vptr_TransformSelector = (_func_int **)0x0;
              (((string *)
               ((long)uVar22._M_t.
                      super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                      .super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>.
                      _M_head_impl + 0x30))->_M_dataplus)._M_p = (pointer)0x0;
              *(size_type *)
               ((long)uVar22._M_t.
                      super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                      .super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>.
                      _M_head_impl + 0x38) = 0;
              std::__cxx11::string::~string((string *)&error);
              *(undefined ***)
               uVar22._M_t.
               super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
               ._M_t.
               super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
               .super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>.
               _M_head_impl = &PTR__TransformSelectorIndexes_0057a5b0;
              *(int *)((long)uVar22._M_t.
                             super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                             .
                             super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>
                             ._M_head_impl + 0x40) = iVar11;
              *(int *)((long)uVar22._M_t.
                             super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                             .
                             super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>
                             ._M_head_impl + 0x44) = iVar12;
              *(int *)((long)uVar22._M_t.
                             super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                             .
                             super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>
                             ._M_head_impl + 0x48) = iVar13;
              if ((__uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                   )command.Selector._M_t.
                    super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                    .super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>.
                    _M_head_impl !=
                  (__uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                   )0x0) {
                lVar18 = *(long *)command.Selector._M_t.
                                  super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                                  .
                                  super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>
                                  ._M_head_impl;
                command.Selector._M_t.
                super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                ._M_t.
                super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                .super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>.
                _M_head_impl = uVar22._M_t.
                               super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                               .
                               super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>
                               ._M_head_impl;
                (**(code **)(lVar18 + 8))();
                uVar22._M_t.
                super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                ._M_t.
                super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                .super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>.
                _M_head_impl = command.Selector._M_t.
                               super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                               .
                               super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>
                               ._M_head_impl;
              }
              goto LAB_001bd37a;
            }
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&error,
                     "sub-command TRANSFORM, selector FOR expects, at least, two numeric values.",
                     (allocator<char> *)&varArgsExpanded);
          cmCommand::SetError(&this->super_cmCommand,(string *)&error);
        }
        else {
          _Var9 = std::operator==((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar25,
                                  &OUTPUT_VARIABLE);
          if (!_Var9) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&error);
            poVar20 = std::operator<<((ostream *)&error,"sub-command TRANSFORM, \'");
            _value = (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start + uVar25;
            local_540._M_current =
                 (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
            cmJoin<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                      ((string *)&varArgsExpanded,
                       (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)&value," ");
            poVar20 = std::operator<<(poVar20,(string *)&varArgsExpanded);
            std::operator<<(poVar20,"\': unexpected argument(s).");
            std::__cxx11::string::~string((string *)&varArgsExpanded);
            std::__cxx11::stringbuf::str();
            cmCommand::SetError(&this->super_cmCommand,(string *)&varArgsExpanded);
            goto LAB_001bdb39;
          }
          if ((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 5 != uVar25 + 1) {
            uVar25 = uVar25 + 2;
            std::__cxx11::string::_M_assign((string *)&command.OutputName);
            uVar22 = command.Selector;
            goto LAB_001bd37a;
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&error,
                     "sub-command TRANSFORM, OUTPUT_VARIABLE expects variable name argument.",
                     (allocator<char> *)&varArgsExpanded);
          cmCommand::SetError(&this->super_cmCommand,(string *)&error);
        }
      }
LAB_001be046:
      std::__cxx11::string::~string((string *)&error);
      goto LAB_001be053;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&error);
    poVar20 = std::operator<<((ostream *)&error,"sub-command TRANSFORM, action ");
    poVar20 = std::operator<<(poVar20,(string *)&p_Var26->_M_node_count);
    poVar20 = std::operator<<(poVar20," expects ");
    poVar20 = (ostream *)std::ostream::operator<<(poVar20,*(int *)((long)(p_Var26 + 1) + 0x18));
    std::operator<<(poVar20," argument(s).");
    std::__cxx11::stringbuf::str();
    cmCommand::SetError(&this->super_cmCommand,&REGEX);
  }
  std::__cxx11::string::~string((string *)&REGEX);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error);
  bVar7 = false;
LAB_001be086:
  std::
  set<ActionDescriptor,_std::function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<ActionDescriptor>_>
  ::~set(&descriptors);
  HandleTransformCommand::Command::~Command(&command);
  return bVar7;
LAB_001be053:
  bVar7 = false;
LAB_001be055:
  std::__cxx11::string::~string((string *)&OUTPUT_VARIABLE);
  std::__cxx11::string::~string((string *)&FOR);
  std::__cxx11::string::~string((string *)&AT);
  std::__cxx11::string::~string((string *)&REGEX);
  goto LAB_001be086;
}

Assistant:

bool cmListCommand::HandleTransformCommand(
  std::vector<std::string> const& args)
{
  if (args.size() < 3) {
    this->SetError(
      "sub-command TRANSFORM requires an action to be specified.");
    return false;
  }

  // Structure collecting all elements of the command
  struct Command
  {
    Command(const std::string& listName)
      : ListName(listName)
      , OutputName(listName)
    {
    }

    std::string Name;
    std::string ListName;
    std::vector<std::string> Arguments;
    std::unique_ptr<TransformAction> Action;
    std::unique_ptr<TransformSelector> Selector;
    std::string OutputName;
  } command(args[1]);

  // Descriptor of action
  // Arity: number of arguments required for the action
  // Transform: lambda function implementing the action
  struct ActionDescriptor
  {
    ActionDescriptor(std::string name)
      : Name(std::move(name))
    {
    }
    ActionDescriptor(std::string name, int arity, transform_type transform)
      : Name(std::move(name))
      , Arity(arity)
#if defined(__GNUC__) && __GNUC__ == 6 && defined(__aarch64__)
      // std::function move constructor miscompiles on this architecture
      , Transform(transform)
#else
      , Transform(std::move(transform))
#endif
    {
    }

    operator const std::string&() const { return Name; }

    std::string Name;
    int Arity = 0;
    transform_type Transform;
  };

  // Build a set of supported actions.
  std::set<ActionDescriptor,
           std::function<bool(const std::string&, const std::string&)>>
    descriptors(
      [](const std::string& x, const std::string& y) { return x < y; });
  descriptors = { { "APPEND", 1,
                    [&command](const std::string& s) -> std::string {
                      if (command.Selector->InSelection(s)) {
                        return s + command.Arguments[0];
                      }

                      return s;
                    } },
                  { "PREPEND", 1,
                    [&command](const std::string& s) -> std::string {
                      if (command.Selector->InSelection(s)) {
                        return command.Arguments[0] + s;
                      }

                      return s;
                    } },
                  { "TOUPPER", 0,
                    [&command](const std::string& s) -> std::string {
                      if (command.Selector->InSelection(s)) {
                        return cmSystemTools::UpperCase(s);
                      }

                      return s;
                    } },
                  { "TOLOWER", 0,
                    [&command](const std::string& s) -> std::string {
                      if (command.Selector->InSelection(s)) {
                        return cmSystemTools::LowerCase(s);
                      }

                      return s;
                    } },
                  { "STRIP", 0,
                    [&command](const std::string& s) -> std::string {
                      if (command.Selector->InSelection(s)) {
                        return cmSystemTools::TrimWhitespace(s);
                      }

                      return s;
                    } },
                  { "GENEX_STRIP", 0,
                    [&command](const std::string& s) -> std::string {
                      if (command.Selector->InSelection(s)) {
                        return cmGeneratorExpression::Preprocess(
                          s,
                          cmGeneratorExpression::StripAllGeneratorExpressions);
                      }

                      return s;
                    } },
                  { "REPLACE", 2,
                    [&command](const std::string& s) -> std::string {
                      if (command.Selector->InSelection(s)) {
                        return command.Action->Transform(s);
                      }

                      return s;
                    } } };

  using size_type = std::vector<std::string>::size_type;
  size_type index = 2;

  // Parse all possible function parameters
  auto descriptor = descriptors.find(args[index]);

  if (descriptor == descriptors.end()) {
    std::ostringstream error;
    error << " sub-command TRANSFORM, " << args[index] << " invalid action.";
    this->SetError(error.str());
    return false;
  }

  // Action arguments
  index += 1;
  if (args.size() < index + descriptor->Arity) {
    std::ostringstream error;
    error << "sub-command TRANSFORM, action " << descriptor->Name
          << " expects " << descriptor->Arity << " argument(s).";
    this->SetError(error.str());
    return false;
  }

  command.Name = descriptor->Name;
  index += descriptor->Arity;
  if (descriptor->Arity > 0) {
    command.Arguments =
      std::vector<std::string>(args.begin() + 3, args.begin() + index);
  }

  if (command.Name == "REPLACE") {
    try {
      command.Action =
        cm::make_unique<TransformReplace>(command.Arguments, this->Makefile);
    } catch (const transform_error& e) {
      this->SetError(e.what());
      return false;
    }
  }

  const std::string REGEX{ "REGEX" }, AT{ "AT" }, FOR{ "FOR" },
    OUTPUT_VARIABLE{ "OUTPUT_VARIABLE" };

  // handle optional arguments
  while (args.size() > index) {
    if ((args[index] == REGEX || args[index] == AT || args[index] == FOR) &&
        command.Selector) {
      std::ostringstream error;
      error << "sub-command TRANSFORM, selector already specified ("
            << command.Selector->Tag << ").";
      this->SetError(error.str());
      return false;
    }

    // REGEX selector
    if (args[index] == REGEX) {
      if (args.size() == ++index) {
        this->SetError("sub-command TRANSFORM, selector REGEX expects "
                       "'regular expression' argument.");
        return false;
      }

      command.Selector = cm::make_unique<TransformSelectorRegex>(args[index]);
      if (!command.Selector->Validate()) {
        std::ostringstream error;
        error << "sub-command TRANSFORM, selector REGEX failed to compile "
                 "regex \"";
        error << args[index] << "\".";
        this->SetError(error.str());
        return false;
      }

      index += 1;
      continue;
    }

    // AT selector
    if (args[index] == AT) {
      // get all specified indexes
      std::vector<int> indexes;
      while (args.size() > ++index) {
        std::size_t pos;
        int value;

        try {
          value = std::stoi(args[index], &pos);
          if (pos != args[index].length()) {
            // this is not a number, stop processing
            break;
          }
          indexes.push_back(value);
        } catch (const std::invalid_argument&) {
          // this is not a number, stop processing
          break;
        }
      }

      if (indexes.empty()) {
        this->SetError(
          "sub-command TRANSFORM, selector AT expects at least one "
          "numeric value.");
        return false;
      }

      command.Selector =
        cm::make_unique<TransformSelectorAt>(std::move(indexes));

      continue;
    }

    // FOR selector
    if (args[index] == FOR) {
      if (args.size() <= ++index + 1) {
        this->SetError("sub-command TRANSFORM, selector FOR expects, at least,"
                       " two arguments.");
        return false;
      }

      int start = 0, stop = 0, step = 1;
      bool valid = true;
      try {
        std::size_t pos;

        start = std::stoi(args[index], &pos);
        if (pos != args[index].length()) {
          // this is not a number
          valid = false;
        } else {
          stop = std::stoi(args[++index], &pos);
          if (pos != args[index].length()) {
            // this is not a number
            valid = false;
          }
        }
      } catch (const std::invalid_argument&) {
        // this is not numbers
        valid = false;
      }
      if (!valid) {
        this->SetError("sub-command TRANSFORM, selector FOR expects, "
                       "at least, two numeric values.");
        return false;
      }
      // try to read a third numeric value for step
      if (args.size() > ++index) {
        try {
          std::size_t pos;

          step = std::stoi(args[index], &pos);
          if (pos != args[index].length()) {
            // this is not a number
            step = 1;
          } else {
            index += 1;
          }
        } catch (const std::invalid_argument&) {
          // this is not number, ignore exception
        }
      }

      if (step < 0) {
        this->SetError("sub-command TRANSFORM, selector FOR expects "
                       "non negative numeric value for <step>.");
      }

      command.Selector =
        cm::make_unique<TransformSelectorFor>(start, stop, step);

      continue;
    }

    // output variable
    if (args[index] == OUTPUT_VARIABLE) {
      if (args.size() == ++index) {
        this->SetError("sub-command TRANSFORM, OUTPUT_VARIABLE "
                       "expects variable name argument.");
        return false;
      }

      command.OutputName = args[index++];
      continue;
    }

    std::ostringstream error;
    error << "sub-command TRANSFORM, '"
          << cmJoin(cmMakeRange(args).advance(index), " ")
          << "': unexpected argument(s).";
    this->SetError(error.str());
    return false;
  }

  // expand the list variable
  std::vector<std::string> varArgsExpanded;
  if (!this->GetList(varArgsExpanded, command.ListName)) {
    this->Makefile->AddDefinition(command.OutputName, "");
    return true;
  }

  if (!command.Selector) {
    // no selector specified, apply transformation to all elements
    command.Selector = cm::make_unique<TransformNoSelector>();
  }

  try {
    command.Selector->Transform(varArgsExpanded, descriptor->Transform);
  } catch (const transform_error& e) {
    this->SetError(e.what());
    return false;
  }

  this->Makefile->AddDefinition(command.OutputName,
                                cmJoin(varArgsExpanded, ";").c_str());

  return true;
}